

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pparsefp.h
# Opt level: O0

char * parse_double(char *buf,size_t len,double *result)

{
  char *pcVar1;
  double *result_local;
  size_t len_local;
  char *buf_local;
  
  pcVar1 = grisu3_parse_double(buf,len,result);
  return pcVar1;
}

Assistant:

static inline const char *parse_double(const char *buf, size_t len, double *result)
{
    return grisu3_parse_double(buf, len, result);
}